

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O3

void __thiscall Database::~Database(Database *this)

{
  IndexTree *this_00;
  pointer pcVar1;
  DatabaseMetadata *__addr;
  ulong uVar2;
  
  this_00 = this->index;
  if (this_00 != (IndexTree *)0x0) {
    IndexTree::~IndexTree(this_00);
  }
  operator_delete(this_00);
  __addr = this->metadata;
  if (__addr->sliceCount != 0) {
    uVar2 = 0;
    do {
      munmap(this->slices[uVar2],0x2000000);
      close(this->slice_fd[uVar2]);
      __addr = this->metadata;
      uVar2 = uVar2 + 1;
    } while (uVar2 < __addr->sliceCount);
  }
  munmap(__addr,0x1000);
  close(this->metadata_fd);
  pcVar1 = (this->file_prefix)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->file_prefix).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Database::~Database() {
    delete index;
    // unmap all opened files
    for (int i = 0; i < metadata->sliceCount; ++i) {
        munmap(slices[i], SLICE_SIZE);
        close(slice_fd[i]);
    }
    munmap(metadata, 4096);
    close(metadata_fd);
}